

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

void * FT_Get_Sfnt_Table(FT_Face face,FT_Sfnt_Tag tag)

{
  FT_Module_Requester p_Var1;
  FT_Module_Interface pvVar2;
  void *pvVar3;
  
  if ((face != (FT_Face)0x0) && ((face->face_flags & 8) != 0)) {
    p_Var1 = ((face->driver->root).clazz)->get_interface;
    if (p_Var1 != (FT_Module_Requester)0x0) {
      pvVar2 = (*p_Var1)(&face->driver->root,"sfnt-table");
      if (pvVar2 != (FT_Module_Interface)0x0) {
        pvVar3 = (void *)(**(code **)((long)pvVar2 + 8))(face,tag);
        return pvVar3;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

FT_EXPORT_DEF( void* )
  FT_Get_Sfnt_Table( FT_Face      face,
                     FT_Sfnt_Tag  tag )
  {
    void*                  table = NULL;
    FT_Service_SFNT_Table  service;


    if ( face && FT_IS_SFNT( face ) )
    {
      FT_FACE_FIND_SERVICE( face, service, SFNT_TABLE );
      if ( service )
        table = service->get_table( face, tag );
    }

    return table;
  }